

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

char * __thiscall TadsHttpReqResult::find_header(TadsHttpReqResult *this,char *name)

{
  byte bVar1;
  int iVar2;
  size_t len;
  byte *pbVar3;
  byte *pbVar4;
  
  len = strlen(name);
  pbVar3 = (byte *)this->hdrs;
  if (pbVar3 != (byte *)0x0) {
    do {
      bVar1 = *pbVar3;
      while (('\0' < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
        bVar1 = pbVar3[1];
        pbVar3 = pbVar3 + 1;
      }
      iVar2 = memicmp(pbVar3,name,len);
      if (iVar2 == 0) {
        bVar1 = pbVar3[len];
        if (bVar1 == 0) {
          pbVar3 = pbVar3 + len;
        }
        else {
          pbVar3 = pbVar3 + len + 1;
          do {
            if ((char)bVar1 < '\0') break;
            iVar2 = isspace((uint)bVar1);
            if (iVar2 == 0) {
              if (bVar1 == 0x3a) {
                do {
                  pbVar4 = pbVar3;
                  if ((char)*pbVar4 < 1) {
                    return (char *)pbVar4;
                  }
                  iVar2 = isspace((int)(char)*pbVar4);
                  pbVar3 = pbVar4 + 1;
                } while (iVar2 != 0);
                return (char *)pbVar4;
              }
              break;
            }
            bVar1 = *pbVar3;
            pbVar3 = pbVar3 + 1;
          } while (bVar1 != 0);
          pbVar3 = pbVar3 + -1;
        }
      }
      pbVar3 = (byte *)next_header(this,(char *)pbVar3);
    } while (pbVar3 != (byte *)0x0);
  }
  return (char *)0x0;
}

Assistant:

const char *find_header(const char *name)
    {
        /* remember the name length */
        size_t namelen = strlen(name);

        /* scan the headers */
        for (const char *p = hdrs ; p != 0 ; p = next_header(p))
        {
            /* skip spaces */
            for ( ; *p != '\0' && is_space(*p) ; ++p) ;

            /* check for a match */
            if (memicmp(p, name, namelen) == 0)
            {
                /* skip the name and any subsequent spaces */
                for (p += namelen ; *p != '\0' && is_space(*p) ; ++p) ;

                /* make sure we have a ':' */
                if (*p == ':')
                {
                    /* skip the ':' and subsequent spaces */
                    for (p += 1 ; *p != '\0' && is_space(*p) ; ++p) ;

                    /* this is the start of the header value */
                    return p;
                }
            }
        }

        /* didn't find it */
        return 0;
    }